

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * decodescript(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff008;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff00c;
  undefined8 in_stack_fffffffffffff010;
  undefined8 in_stack_fffffffffffff018;
  undefined8 in_stack_fffffffffffff020;
  _Manager_type in_stack_fffffffffffff028;
  undefined8 in_stack_fffffffffffff030;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff038;
  pointer in_stack_fffffffffffff048;
  pointer pRVar7;
  pointer in_stack_fffffffffffff050;
  pointer pRVar8;
  pointer in_stack_fffffffffffff058;
  pointer pRVar9;
  undefined8 in_stack_fffffffffffff060;
  pointer in_stack_fffffffffffff068;
  pointer pRVar10;
  pointer in_stack_fffffffffffff070;
  pointer pRVar11;
  pointer in_stack_fffffffffffff078;
  pointer pRVar12;
  undefined8 in_stack_fffffffffffff080;
  pointer in_stack_fffffffffffff088;
  pointer pRVar13;
  pointer in_stack_fffffffffffff090;
  pointer pRVar14;
  pointer in_stack_fffffffffffff098;
  pointer pRVar15;
  undefined8 in_stack_fffffffffffff0a0;
  pointer in_stack_fffffffffffff0a8;
  pointer pRVar16;
  pointer in_stack_fffffffffffff0b0;
  pointer pRVar17;
  pointer in_stack_fffffffffffff0b8;
  undefined8 in_stack_fffffffffffff0c0;
  pointer in_stack_fffffffffffff0c8;
  pointer in_stack_fffffffffffff0d0;
  pointer in_stack_fffffffffffff0d8;
  undefined8 in_stack_fffffffffffff0e0;
  pointer in_stack_fffffffffffff0e8;
  allocator<char> local_efa;
  allocator<char> local_ef9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ef8;
  allocator<char> local_eda;
  allocator<char> local_ed9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ed8;
  allocator<char> local_eba;
  allocator<char> local_eb9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_eb8;
  allocator<char> local_e9a;
  allocator<char> local_e99;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e98;
  allocator<char> local_e79;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e78;
  allocator<char> local_e5a;
  allocator<char> local_e59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e58;
  allocator<char> local_e32;
  allocator<char> local_e31;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e30;
  allocator<char> local_e12;
  allocator<char> local_e11;
  RPCResults local_e10;
  allocator_type local_df3;
  allocator<char> local_df2;
  allocator<char> local_df1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_df0;
  allocator<char> local_dd2;
  allocator<char> local_dd1;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  char *local_cf0;
  size_type local_ce8;
  char local_ce0 [8];
  undefined8 uStack_cd8;
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  RPCResult local_b50 [4];
  RPCResult local_930;
  RPCResult local_8a8;
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  RPCResult local_660 [4];
  RPCResult local_440;
  RPCResult local_3b8;
  string local_330 [32];
  string local_310 [32];
  RPCResult local_2f0;
  RPCArgOptions local_268;
  string local_220 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"decodescript",&local_dd1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nDecode a hex-encoded script.\n",&local_dd2);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"hexstring",&local_df1);
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_220,"the hex-encoded script",&local_df2);
  local_268.oneline_description._M_dataplus._M_p = (pointer)&local_268.oneline_description.field_2;
  local_268.skip_type_check = false;
  local_268.oneline_description._M_string_length = 0;
  local_268.oneline_description.field_2._M_local_buf[0] = '\0';
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_268._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff008;
  name._M_string_length = in_stack_fffffffffffff010;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  name.field_2._8_8_ = in_stack_fffffffffffff020;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff030;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff028;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff038;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff048;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff050;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff058;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff060;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff068;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff070;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff078;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff080;
  description_13._M_string_length = (size_type)in_stack_fffffffffffff090;
  description_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff088;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff098;
  description_13.field_2._8_8_ = in_stack_fffffffffffff0a0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0b0;
  opts._0_8_ = in_stack_fffffffffffff0a8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff0b8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff0c0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff0c8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff0d0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff0d8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0e0;
  opts._64_8_ = in_stack_fffffffffffff0e8;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_df0,__l,&local_df3);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_e11);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_e12);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"asm",&local_e31);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a0,"Disassembly of the script",&local_e32);
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff008;
  m_key_name._M_string_length = in_stack_fffffffffffff010;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff020;
  description._M_string_length = in_stack_fffffffffffff030;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description.field_2 = in_stack_fffffffffffff038;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff050;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff048;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(local_660,STR,m_key_name,description,inner,SUB81(local_680,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"desc",&local_e59);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"Inferred descriptor for the script",&local_e5a);
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff008;
  m_key_name_00._M_string_length = in_stack_fffffffffffff010;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff020;
  description_00._M_string_length = in_stack_fffffffffffff030;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_00.field_2 = in_stack_fffffffffffff038;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(local_660 + 1,STR,m_key_name_00,description_00,inner_00,SUB81(local_6c0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_700,"type",&local_e79);
  GetAllOutputTypes_abi_cxx11_();
  std::operator+(&local_740,"The output type (e.g. ",&local_760);
  std::operator+(&local_720,&local_740,")");
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff008;
  m_key_name_01._M_string_length = in_stack_fffffffffffff010;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff020;
  description_01._M_string_length = in_stack_fffffffffffff030;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_01.field_2 = in_stack_fffffffffffff038;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(local_660 + 2,STR,m_key_name_01,description_01,inner_01,false);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"address",&local_e99);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a0,"The Bitcoin address (only if a well-defined address exists)",&local_e9a);
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_fffffffffffff010;
  auVar1._0_4_ = in_stack_fffffffffffff00c;
  auVar1._12_8_ = in_stack_fffffffffffff018;
  auVar1._20_8_ = in_stack_fffffffffffff020;
  auVar1._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff030;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_02.field_2 = in_stack_fffffffffffff038;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult
            (local_660 + 3,STR,(string)(auVar1 << 0x20),SUB81(local_780,0),description_02,inner_02,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"p2sh",&local_eb9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e0,
             "address of P2SH script wrapping this redeem script (not returned for types that should not be wrapped)"
             ,&local_eba);
  local_ed8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ed8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ed8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff010;
  auVar2._0_4_ = in_stack_fffffffffffff00c;
  auVar2._12_8_ = in_stack_fffffffffffff018;
  auVar2._20_8_ = in_stack_fffffffffffff020;
  auVar2._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff030;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_03.field_2 = in_stack_fffffffffffff038;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult
            (&local_440,STR,(string)(auVar2 << 0x20),SUB81(local_7c0,0),description_03,inner_03,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_800,"segwit",&local_ed9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_820,
             "Result of a witness output script wrapping this redeem script (not returned for types that should not be wrapped)"
             ,&local_eda);
  std::__cxx11::string::string<std::allocator<char>>(local_b70,"asm",&local_ef9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b90,"Disassembly of the output script",&local_efa);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_02._M_string_length = in_stack_fffffffffffff010;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff020;
  description_04._M_string_length = in_stack_fffffffffffff030;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_04.field_2 = in_stack_fffffffffffff038;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(local_b50,STR,m_key_name_02,description_04,inner_04,SUB81(local_b70,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_bb0,"hex",(allocator<char> *)&stack0xfffffffffffff0e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bd0,"The raw output script bytes, hex-encoded",
             (allocator<char> *)&stack0xfffffffffffff0e6);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_03._M_string_length = in_stack_fffffffffffff010;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff020;
  description_05._M_string_length = in_stack_fffffffffffff030;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_05.field_2 = in_stack_fffffffffffff038;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult
            (local_b50 + 1,STR_HEX,m_key_name_03,description_05,inner_05,SUB81(local_bb0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_bf0,"type",(allocator<char> *)&stack0xfffffffffffff0c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c10,
             "The type of the output script (e.g. witness_v0_keyhash or witness_v0_scripthash)",
             (allocator<char> *)&stack0xfffffffffffff0c6);
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_04._M_string_length = in_stack_fffffffffffff010;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff020;
  description_06._M_string_length = in_stack_fffffffffffff030;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_06.field_2 = in_stack_fffffffffffff038;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(local_b50 + 2,STR,m_key_name_04,description_06,inner_06,SUB81(local_bf0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_c30,"address",(allocator<char> *)&stack0xfffffffffffff0a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c50,"The Bitcoin address (only if a well-defined address exists)",
             (allocator<char> *)&stack0xfffffffffffff0a6);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  uVar6 = 0;
  auVar3._4_8_ = in_stack_fffffffffffff010;
  auVar3._0_4_ = in_stack_fffffffffffff00c;
  auVar3._12_8_ = in_stack_fffffffffffff018;
  auVar3._20_8_ = in_stack_fffffffffffff020;
  auVar3._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff030;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_07.field_2 = in_stack_fffffffffffff038;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult
            (local_b50 + 3,STR,(string)(auVar3 << 0x20),SUB81(local_c30,0),description_07,inner_07,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c70,"desc",(allocator<char> *)&stack0xfffffffffffff087);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c90,"Inferred descriptor for the script",
             (allocator<char> *)&stack0xfffffffffffff086);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_05._M_string_length = in_stack_fffffffffffff010;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff020;
  description_08._M_string_length = in_stack_fffffffffffff030;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_08.field_2 = in_stack_fffffffffffff038;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff050;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff048;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff058;
  RPCResult::RPCResult(&local_930,STR,m_key_name_05,description_08,inner_08,SUB81(local_c70,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_cb0,"p2sh-segwit",(allocator<char> *)&stack0xfffffffffffff067);
  std::__cxx11::string::string<std::allocator<char>>
            (local_cd0,"address of the P2SH script wrapping this witness redeem script",
             (allocator<char> *)&stack0xfffffffffffff066);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_06._M_string_length = in_stack_fffffffffffff010;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff020;
  description_09._M_string_length = in_stack_fffffffffffff030;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff038._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_8a8,STR,m_key_name_06,description_09,inner_09,SUB81(local_cb0,0));
  __l_00._M_len = 6;
  __l_00._M_array = local_b50;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_ef8,__l_00,(allocator_type *)&stack0xfffffffffffff047);
  uVar6 = 0;
  auVar4._4_8_ = in_stack_fffffffffffff010;
  auVar4._0_4_ = in_stack_fffffffffffff00c;
  auVar4._12_8_ = in_stack_fffffffffffff018;
  auVar4._20_8_ = in_stack_fffffffffffff020;
  auVar4._28_4_ = 0;
  description_10._M_string_length = in_stack_fffffffffffff030;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_10.field_2._M_local_buf = in_stack_fffffffffffff038._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_3b8,OBJ,(string)(auVar4 << 0x20),false,description_10,inner_10,true);
  __l_01._M_len = 6;
  __l_01._M_array = local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_e30,__l_01,(allocator_type *)&stack0xfffffffffffff046);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff00c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_07._M_string_length = in_stack_fffffffffffff010;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff018;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff020;
  description_11._M_string_length = in_stack_fffffffffffff030;
  description_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff028;
  description_11.field_2 = in_stack_fffffffffffff038;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_07,description_11,inner_11,SUB81(local_310,0));
  result._4_4_ = in_stack_fffffffffffff00c;
  result.m_type = uVar6;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff010;
  result.m_key_name._M_string_length = in_stack_fffffffffffff018;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff020;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff028;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff030;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff038;
  result._64_8_ = pRVar7;
  result.m_description._M_dataplus._M_p = (pointer)pRVar8;
  result.m_description._M_string_length = (size_type)pRVar9;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff060;
  result.m_description.field_2._8_8_ = pRVar10;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar11;
  result.m_cond._M_string_length = (size_type)pRVar12;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff080;
  result.m_cond.field_2._8_8_ = pRVar13;
  RPCResults::RPCResults(&local_e10,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"decodescript",(allocator<char> *)&stack0xfffffffffffff045);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d70,"\"hexstring\"",(allocator<char> *)&stack0xfffffffffffff044);
  HelpExampleCli(&local_d30,&local_d50,&local_d70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db0,"decodescript",(allocator<char> *)&stack0xfffffffffffff043);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dd0,"\"hexstring\"",(allocator<char> *)&stack0xfffffffffffff042);
  HelpExampleRpc(&local_d90,&local_db0,&local_dd0);
  std::operator+(&local_d10,&local_d30,&local_d90);
  local_cf0 = local_ce0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d10._M_dataplus._M_p == &local_d10.field_2) {
    uStack_cd8 = local_d10.field_2._8_8_;
  }
  else {
    local_cf0 = local_d10._M_dataplus._M_p;
  }
  local_ce8 = local_d10._M_string_length;
  local_d10._M_string_length = 0;
  local_d10.field_2._M_local_buf[0] = '\0';
  description_12._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:536:9)>
       ::_M_invoke;
  description_12._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:536:9)>
                ::_M_manager;
  description_12.field_2 = in_stack_fffffffffffff038;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff060;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar11;
  examples.m_examples._M_string_length = in_stack_fffffffffffff080;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar13;
  examples.m_examples.field_2._8_8_ = pRVar14;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff0a0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar15;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar16;
  fun._M_invoker = (_Invoker_type)pRVar17;
  local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff010,&stack0xfffffffffffff018)),
             description_12,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff018);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_d50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e10.m_results);
  RPCResult::~RPCResult(&local_2f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e30);
  lVar5 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_660[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ef8);
  lVar5 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_b50[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff048);
  std::__cxx11::string::~string(local_cd0);
  std::__cxx11::string::~string(local_cb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff068);
  std::__cxx11::string::~string(local_c90);
  std::__cxx11::string::~string(local_c70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff088);
  std::__cxx11::string::~string(local_c50);
  std::__cxx11::string::~string(local_c30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0a8);
  std::__cxx11::string::~string(local_c10);
  std::__cxx11::string::~string(local_bf0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0c8);
  std::__cxx11::string::~string(local_bd0);
  std::__cxx11::string::~string(local_bb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0e8);
  std::__cxx11::string::~string(local_b90);
  std::__cxx11::string::~string(local_b70);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_800);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ed8);
  std::__cxx11::string::~string(local_7e0);
  std::__cxx11::string::~string(local_7c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_eb8);
  std::__cxx11::string::~string(local_7a0);
  std::__cxx11::string::~string(local_780);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e98);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string(local_700);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e78);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_6c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e58);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_310);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_df0);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_268);
  std::__cxx11::string::~string(local_220);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodescript()
{
    return RPCHelpMan{
        "decodescript",
        "\nDecode a hex-encoded script.\n",
        {
            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "the hex-encoded script"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "asm", "Disassembly of the script"},
                {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                {RPCResult::Type::STR, "type", "The output type (e.g. " + GetAllOutputTypes() + ")"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                {RPCResult::Type::STR, "p2sh", /*optional=*/true,
                 "address of P2SH script wrapping this redeem script (not returned for types that should not be wrapped)"},
                {RPCResult::Type::OBJ, "segwit", /*optional=*/true,
                 "Result of a witness output script wrapping this redeem script (not returned for types that should not be wrapped)",
                 {
                     {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                     {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                     {RPCResult::Type::STR, "type", "The type of the output script (e.g. witness_v0_keyhash or witness_v0_scripthash)"},
                     {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                     {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                     {RPCResult::Type::STR, "p2sh-segwit", "address of the P2SH script wrapping this witness redeem script"},
                 }},
            },
        },
        RPCExamples{
            HelpExampleCli("decodescript", "\"hexstring\"")
          + HelpExampleRpc("decodescript", "\"hexstring\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue r(UniValue::VOBJ);
    CScript script;
    if (request.params[0].get_str().size() > 0){
        std::vector<unsigned char> scriptData(ParseHexV(request.params[0], "argument"));
        script = CScript(scriptData.begin(), scriptData.end());
    } else {
        // Empty scripts are valid
    }
    ScriptToUniv(script, /*out=*/r, /*include_hex=*/false, /*include_address=*/true);

    std::vector<std::vector<unsigned char>> solutions_data;
    const TxoutType which_type{Solver(script, solutions_data)};

    const bool can_wrap{[&] {
        switch (which_type) {
        case TxoutType::MULTISIG:
        case TxoutType::NONSTANDARD:
        case TxoutType::PUBKEY:
        case TxoutType::PUBKEYHASH:
        case TxoutType::WITNESS_V0_KEYHASH:
        case TxoutType::WITNESS_V0_SCRIPTHASH:
            // Can be wrapped if the checks below pass
            break;
        case TxoutType::NULL_DATA:
        case TxoutType::SCRIPTHASH:
        case TxoutType::WITNESS_UNKNOWN:
        case TxoutType::WITNESS_V1_TAPROOT:
        case TxoutType::ANCHOR:
            // Should not be wrapped
            return false;
        } // no default case, so the compiler can warn about missing cases
        if (!script.HasValidOps() || script.IsUnspendable()) {
            return false;
        }
        for (CScript::const_iterator it{script.begin()}; it != script.end();) {
            opcodetype op;
            CHECK_NONFATAL(script.GetOp(it, op));
            if (op == OP_CHECKSIGADD || IsOpSuccess(op)) {
                return false;
            }
        }
        return true;
    }()};

    if (can_wrap) {
        r.pushKV("p2sh", EncodeDestination(ScriptHash(script)));
        // P2SH and witness programs cannot be wrapped in P2WSH, if this script
        // is a witness program, don't return addresses for a segwit programs.
        const bool can_wrap_P2WSH{[&] {
            switch (which_type) {
            case TxoutType::MULTISIG:
            case TxoutType::PUBKEY:
            // Uncompressed pubkeys cannot be used with segwit checksigs.
            // If the script contains an uncompressed pubkey, skip encoding of a segwit program.
                for (const auto& solution : solutions_data) {
                    if ((solution.size() != 1) && !CPubKey(solution).IsCompressed()) {
                        return false;
                    }
                }
                return true;
            case TxoutType::NONSTANDARD:
            case TxoutType::PUBKEYHASH:
                // Can be P2WSH wrapped
                return true;
            case TxoutType::NULL_DATA:
            case TxoutType::SCRIPTHASH:
            case TxoutType::WITNESS_UNKNOWN:
            case TxoutType::WITNESS_V0_KEYHASH:
            case TxoutType::WITNESS_V0_SCRIPTHASH:
            case TxoutType::WITNESS_V1_TAPROOT:
            case TxoutType::ANCHOR:
                // Should not be wrapped
                return false;
            } // no default case, so the compiler can warn about missing cases
            NONFATAL_UNREACHABLE();
        }()};
        if (can_wrap_P2WSH) {
            UniValue sr(UniValue::VOBJ);
            CScript segwitScr;
            FlatSigningProvider provider;
            if (which_type == TxoutType::PUBKEY) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(Hash160(solutions_data[0])));
            } else if (which_type == TxoutType::PUBKEYHASH) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(uint160{solutions_data[0]}));
            } else {
                // Scripts that are not fit for P2WPKH are encoded as P2WSH.
                provider.scripts[CScriptID(script)] = script;
                segwitScr = GetScriptForDestination(WitnessV0ScriptHash(script));
            }
            ScriptToUniv(segwitScr, /*out=*/sr, /*include_hex=*/true, /*include_address=*/true, /*provider=*/&provider);
            sr.pushKV("p2sh-segwit", EncodeDestination(ScriptHash(segwitScr)));
            r.pushKV("segwit", std::move(sr));
        }
    }

    return r;
},
    };
}